

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_api_v2.c
# Opt level: O2

MPP_RET h264e_pskip_ref_check(H264eDpb *dpb,H264eFrmInfo *frms)

{
  int iVar1;
  H264eDpbFrm *pHVar2;
  H264eDpbFrm *pHVar3;
  long lVar4;
  
  pHVar2 = dpb->curr;
  pHVar3 = dpb->refr;
  if (((pHVar2->status).val & 0x2000000000) != 0) {
    iVar1 = frms->refr_idx;
    for (lVar4 = 0; lVar4 != 0x380; lVar4 = lVar4 + 0x38) {
      *(uint *)((long)&dpb->frames[0].as_pskip_ref + lVar4) =
           (uint)(*(int *)((long)&dpb->frames[0].slot_idx + lVar4) == iVar1);
    }
  }
  if ((((pHVar3->status).val & 0x2000000000) == 0) && (((pHVar2->status).val & 0x2000000000) == 0))
  {
    for (lVar4 = 0; lVar4 != 0x380; lVar4 = lVar4 + 0x38) {
      *(undefined4 *)((long)&dpb->frames[0].as_pskip_ref + lVar4) = 0;
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_pskip_ref_check(H264eDpb *dpb, H264eFrmInfo *frms)
{
    H264eDpbFrm *curr = NULL;
    H264eDpbFrm *refr = NULL;
    RK_U32 i;
    MPP_RET ret = MPP_OK;

    curr = dpb->curr;
    refr = dpb->refr;

    if (curr->status.force_pskip_is_ref) {
        H264eDpbFrm *temp_frm;
        for (i = 0; i < H264E_MAX_REFS_CNT; i++) {
            temp_frm = &dpb->frames[i];
            if (temp_frm->slot_idx != frms->refr_idx) {
                temp_frm->as_pskip_ref = 0;
            } else {
                temp_frm->as_pskip_ref = 1;
            }
        }
    }

    if (!refr->status.force_pskip_is_ref && !curr->status.force_pskip_is_ref) {
        H264eDpbFrm *temp_frm;
        for (i = 0; i < H264E_MAX_REFS_CNT; i++) {
            temp_frm = &dpb->frames[i];
            if (temp_frm) {
                temp_frm->as_pskip_ref = 0;
            }
        }
    }

    return ret;
}